

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

double r8_hyper_2f1(double a,double b,double c,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ostream *poVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double local_138;
  double local_c8;
  
  if (c < 0.0) {
    if (((double)(int)c == c) && (!NAN((double)(int)c) && !NAN(c))) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"R8_HYPER_2F1 - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  The hypergeometric series is divergent.\n");
      std::operator<<((ostream *)&std::cerr,"  C is integral and negative.\n");
      poVar13 = std::operator<<((ostream *)&std::cerr,"  C = ");
      x = c;
      goto LAB_001ccfbb;
    }
  }
  dVar21 = 1.0 - x;
  dVar29 = c - a;
  dVar27 = dVar29 - b;
  if ((dVar21 < 1e-15) && (dVar27 <= 0.0)) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"R8_HYPER_2F1 - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  The hypergeometric series is divergent.\n");
    std::operator<<((ostream *)&std::cerr,"  1 - X < 0, C - A - B <= 0\n");
    poVar13 = std::operator<<((ostream *)&std::cerr,"  A = ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,a);
    std::operator<<(poVar13,"\n");
    poVar13 = std::operator<<((ostream *)&std::cerr,"  B = ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,b);
    std::operator<<(poVar13,"\n");
    poVar13 = std::operator<<((ostream *)&std::cerr,"  C = ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,c);
    std::operator<<(poVar13,"\n");
    poVar13 = std::operator<<((ostream *)&std::cerr,"  X = ");
LAB_001ccfbb:
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,x);
    std::operator<<(poVar13,"\n");
    exit(1);
  }
  if ((b == 0.0) && (!NAN(b))) {
    return 1.0;
  }
  if ((a == 0.0) && (!NAN(a))) {
    return 1.0;
  }
  if ((x == 0.0) && (!NAN(x))) {
    return 1.0;
  }
  dVar30 = c - b;
  dVar25 = *(double *)(&DAT_00226ba0 + (ulong)(0.95 < x) * 8);
  if (((dVar27 <= 0.0) || (dVar21 != dVar25)) || (NAN(dVar21) || NAN(dVar25))) {
    if ((dVar25 < x + 1.0) || (dVar25 < ABS(dVar29 + b + -1.0))) {
      if ((double)(int)a == a && a < 0.0 || (double)(int)b == b && 0.0 > b) {
        dVar21 = ABS(b);
        if ((double)(int)b != b || 0.0 <= b) {
          dVar21 = ABS(a);
        }
        iVar11 = (int)dVar21;
        if (iVar11 < 1) {
          return 1.0;
        }
        dVar29 = 1.0;
        dVar21 = 1.0;
        dVar27 = dVar29;
        do {
          dVar29 = (((dVar27 + b + -1.0) * (dVar27 + a + -1.0) * dVar29) /
                   ((dVar27 + c + -1.0) * dVar27)) * x;
          dVar21 = dVar21 + dVar29;
          dVar27 = dVar27 + 1.0;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        return dVar21;
      }
      if (dVar29 <= 0.0 && (double)(int)dVar29 == dVar29 ||
          0.0 >= dVar30 && (double)(int)dVar30 == dVar30) {
        dVar25 = dVar30;
        if (0.0 < dVar30 || (double)(int)dVar30 != dVar30) {
          dVar25 = dVar29;
        }
        iVar11 = (int)ABS(dVar25);
        if (iVar11 < 1) {
          dVar25 = 1.0;
        }
        else {
          dVar31 = 1.0;
          dVar25 = 1.0;
          dVar6 = dVar31;
          do {
            dVar31 = (((dVar30 + dVar6 + -1.0) * (dVar29 + dVar6 + -1.0) * dVar31) /
                     ((dVar6 + c + -1.0) * dVar6)) * x;
            dVar25 = dVar25 + dVar31;
            dVar6 = dVar6 + 1.0;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        dVar21 = pow(dVar21,dVar27);
        return dVar21 * dVar25;
      }
      dVar29 = a;
      dVar27 = x;
      if (x < 0.0) {
        if (((a < c) && (b < a)) && (0.0 < b)) {
          dVar29 = b;
          b = a;
        }
        b = c - b;
        dVar27 = x / (x + -1.0);
      }
      if (0.75 <= dVar27) {
        dVar4 = c - dVar29;
        dVar5 = dVar4 - b;
        dVar30 = (double)(int)dVar5;
        dVar6 = tgamma(dVar29);
        dVar31 = tgamma(b);
        dVar23 = tgamma(c);
        if (1e-15 <= ABS(dVar5 - dVar30)) {
          dVar30 = tgamma(dVar4);
          dVar7 = tgamma(c - b);
          dVar1 = tgamma(dVar5);
          dVar2 = (b + dVar29) - c;
          dVar22 = tgamma(dVar2);
          dVar7 = (dVar1 * dVar23) / (dVar7 * dVar30);
          dVar27 = 1.0 - dVar27;
          dVar30 = pow(dVar27,dVar5);
          dVar30 = dVar30 * ((dVar22 * dVar23) / (dVar6 * dVar31));
          uVar17 = 1;
          dVar31 = dVar30;
          dVar23 = dVar7;
          dVar6 = 0.0;
          do {
            dVar1 = (double)(int)uVar17;
            dVar23 = (((b + dVar1 + -1.0) * (dVar29 + dVar1 + -1.0) * dVar23) /
                     ((dVar2 + dVar1) * dVar1)) * dVar27;
            dVar31 = ((((c - b) + dVar1 + -1.0) * (dVar4 + dVar1 + -1.0) * dVar31) /
                     ((dVar5 + dVar1) * dVar1)) * dVar27;
            dVar1 = dVar6 + dVar23 + dVar31;
            if (ABS(dVar1 - dVar6) < ABS(dVar1) * dVar25) goto LAB_001cc472;
            uVar17 = uVar17 + 1;
            dVar6 = dVar1;
          } while (uVar17 != 0xfb);
          uVar17 = 0xfb;
LAB_001cc472:
          dVar7 = dVar7 + dVar1;
        }
        else {
          uVar15 = (uint)dVar5;
          dVar4 = tgamma(dVar29 + dVar30);
          dVar5 = tgamma(b + dVar30);
          dVar1 = r8_psi(dVar29);
          dVar2 = r8_psi(b);
          dVar22 = 0.0;
          if (uVar15 != 0) {
            dVar22 = 1.0;
          }
          uVar16 = -uVar15;
          uVar17 = uVar15;
          if ((int)uVar15 < 1) {
            uVar17 = uVar16;
          }
          if (1 < uVar17) {
            iVar11 = uVar17 - 1;
            dVar7 = 1.0;
            do {
              dVar22 = dVar22 * dVar7;
              dVar7 = dVar7 + 1.0;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          if (uVar15 == 0) {
            dVar8 = 1.0;
          }
          else {
            dVar8 = 1.0;
            dVar7 = dVar8;
            do {
              dVar8 = dVar8 * dVar7;
              dVar7 = dVar7 + 1.0;
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
          if (-1 < (int)uVar15) {
            local_138 = -dVar23;
            dVar7 = pow(dVar27 + -1.0,dVar30);
            if ((int)uVar15 < 2) {
              dVar26 = 1.0;
            }
            else {
              uVar17 = 1;
              dVar18 = 1.0;
              dVar26 = 1.0;
              dVar24 = 1.0;
              do {
                dVar18 = (((b + dVar24 + -1.0) * (dVar29 + dVar24 + -1.0) * dVar18) /
                         (double)(int)((uVar16 + uVar17) * uVar17)) * (1.0 - dVar27);
                dVar26 = dVar26 + dVar18;
                dVar24 = dVar24 + 1.0;
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar15);
            }
            local_c8 = 0.0;
            dVar18 = 0.0;
            if (uVar15 != 0) {
              uVar17 = 1;
              if (1 < (int)uVar15) {
                uVar17 = uVar15;
              }
              dVar24 = 1.0;
              do {
                dVar18 = -1.0 / dVar24 +
                         1.0 / (b + dVar24 + -1.0) + 1.0 / (dVar29 + dVar24 + -1.0) + dVar18;
                dVar24 = dVar24 + 1.0;
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
            }
            dVar27 = 1.0 - dVar27;
            dVar24 = log(dVar27);
            uVar17 = 1;
            uVar16 = 1;
            if (1 < (int)uVar15) {
              uVar16 = uVar15;
            }
            iVar11 = 2;
            dVar28 = 1.0;
            dVar18 = dVar24 + dVar18 + dVar1 + dVar2 + 1.1544313298030657;
            do {
              dVar20 = 1.0;
              dVar9 = (double)(int)uVar17;
              dVar24 = 0.0;
              uVar14 = uVar16;
              iVar12 = iVar11;
              uVar10 = uVar15;
              while (uVar10 != 0) {
                dVar24 = 1.0 / (b + dVar20 + dVar9 + -1.0) +
                         (1.0 - dVar29) / ((dVar29 + dVar20 + dVar9 + -1.0) * (double)iVar12) +
                         dVar24;
                dVar20 = dVar20 + 1.0;
                iVar12 = iVar12 + 1;
                uVar14 = uVar14 - 1;
                uVar10 = uVar14;
              }
              local_c8 = (1.0 - b) / ((b + dVar9 + -1.0) * dVar9) +
                         local_c8 + (1.0 - dVar29) / ((dVar29 + dVar9 + -1.0) * dVar9);
              dVar20 = log(dVar27);
              dVar28 = (((dVar9 + b + dVar30 + -1.0) * dVar28 * (dVar29 + dVar30 + dVar9 + -1.0)) /
                       (double)(int)((uVar17 + uVar15) * uVar17)) * dVar27;
              dVar24 = (dVar20 + dVar1 + dVar2 + 1.1544313298030657 + local_c8 + dVar24) * dVar28 +
                       dVar18;
              if (ABS(dVar24 - dVar18) < ABS(dVar24) * dVar25) goto LAB_001ccda1;
              uVar17 = uVar17 + 1;
              iVar11 = iVar11 + 1;
              dVar18 = dVar24;
            } while (uVar17 != 0xfb);
            uVar17 = 0xfb;
LAB_001ccda1:
            dVar30 = dVar26 * ((dVar23 * dVar22) / (dVar4 * dVar5)) +
                     ((dVar7 * local_138) / (dVar6 * dVar31 * dVar8)) * dVar24;
            goto LAB_001ccdbb;
          }
          dVar27 = 1.0 - dVar27;
          dVar7 = (double)(int)uVar16;
          dVar26 = pow(dVar27,dVar7);
          dVar18 = pow(-1.0,dVar7);
          dVar30 = 1.0;
          if (uVar15 != 0xffffffff) {
            iVar11 = 1;
            dVar30 = 1.0;
            dVar24 = 1.0;
            dVar28 = 1.0;
            do {
              dVar24 = ((((b - dVar7) + dVar28 + -1.0) * ((dVar29 - dVar7) + dVar28 + -1.0) * dVar24
                        ) / (double)(int)((uVar15 + iVar11) * iVar11)) * dVar27;
              dVar30 = dVar30 + dVar24;
              dVar28 = dVar28 + 1.0;
              iVar11 = iVar11 + 1;
            } while (uVar15 + iVar11 != 0);
          }
          uVar14 = 1;
          if (1 < (int)uVar16) {
            uVar14 = uVar16;
          }
          dVar7 = 0.0;
          dVar24 = 1.0;
          uVar17 = uVar14;
          do {
            dVar7 = dVar7 + 1.0 / dVar24;
            dVar24 = dVar24 + 1.0;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
          dVar24 = log(dVar27);
          dVar28 = 1.0;
          uVar17 = 1;
          dVar20 = 0.0;
          iVar11 = 2;
          dVar24 = dVar24 + ((dVar1 + dVar2) - dVar7) + 1.1544313298030657;
          do {
            dVar7 = (double)(int)uVar17;
            dVar9 = dVar29 + dVar7 + -1.0;
            dVar19 = b + dVar7 + -1.0;
            dVar20 = (1.0 - b) / (dVar7 * dVar19) + (1.0 - dVar29) / (dVar9 * dVar7) + dVar20;
            dVar7 = 0.0;
            iVar12 = iVar11;
            uVar16 = uVar14;
            do {
              dVar7 = dVar7 + 1.0 / (double)iVar12;
              iVar12 = iVar12 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
            dVar3 = log(dVar27);
            dVar28 = ((dVar19 * dVar28 * dVar9) / (double)(int)((uVar17 - uVar15) * uVar17)) *
                     dVar27;
            dVar7 = (dVar3 + ((dVar1 + dVar2 + 1.1544313298030657 + dVar20) - dVar7)) * dVar28 +
                    dVar24;
            if (ABS(dVar7 - dVar24) < ABS(dVar7) * dVar25) goto LAB_001cc9d2;
            uVar17 = uVar17 + 1;
            iVar11 = iVar11 + 1;
            dVar24 = dVar7;
          } while (uVar17 != 0xfb);
          uVar17 = 0xfb;
LAB_001cc9d2:
          dVar7 = ((-dVar18 * dVar23) / (dVar4 * dVar5 * dVar8)) * dVar7;
          dVar30 = dVar30 * ((dVar22 * dVar23) / (dVar26 * dVar6 * dVar31));
        }
        dVar30 = dVar30 + dVar7;
      }
      else {
        if ((((b + b <= c) || (c <= b)) || (c <= dVar29)) || (dVar29 + dVar29 <= c)) {
          dVar30 = 1.0;
        }
        else {
          dVar29 = c - dVar29;
          dVar30 = pow(1.0 - dVar27,dVar29 - b);
          b = c - b;
        }
        dVar31 = 1.0;
        uVar17 = 1;
        dVar6 = 1.0;
        do {
          dVar23 = (double)(int)uVar17;
          dVar31 = (((b + dVar23 + -1.0) * (dVar29 + dVar23 + -1.0) * dVar31) /
                   ((dVar23 + c + -1.0) * dVar23)) * dVar27;
          dVar23 = dVar6 + dVar31;
          if (ABS(dVar23 - dVar6) <= ABS(dVar23) * dVar25) goto LAB_001cc525;
          uVar17 = uVar17 + 1;
          dVar6 = dVar23;
        } while (uVar17 != 0xfb);
        uVar17 = 0xfb;
LAB_001cc525:
        dVar30 = dVar30 * dVar23;
      }
LAB_001ccdbb:
      if (x < 0.0) {
        dVar21 = pow(dVar21,a);
        dVar30 = dVar30 * (1.0 / dVar21);
      }
      if (uVar17 < 0x79) {
        return dVar30;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"R8_HYPER_2F1 - Warning!\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  A large number of iterations were needed.\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  The accuracy of the results should be checked.\n",0x31);
      return dVar30;
    }
    dVar29 = exp2(-a);
    dVar21 = tgamma(c);
    dVar25 = tgamma((a * 0.5 + 1.0) - b);
    dVar27 = tgamma(a * 0.5 + 0.5);
    dVar21 = dVar21 * dVar29 * 1.7724538509055159;
    dVar27 = dVar27 * dVar25;
  }
  else {
    dVar25 = tgamma(c);
    dVar21 = tgamma(dVar27);
    dVar29 = tgamma(dVar29);
    dVar27 = tgamma(dVar30);
    dVar21 = dVar21 * dVar25;
    dVar27 = dVar27 * dVar29;
  }
  return dVar21 / dVar27;
}

Assistant:

double r8_hyper_2f1 ( double a, double b, double c, double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_HYPER_2F1 evaluates the hypergeometric function F(A,B,C,X).
//
//  Discussion:
//
//    A minor bug was corrected.  The HW variable, used in several places as
//    the "old" value of a quantity being iteratively improved, was not
//    being initialized.  JVB, 11 February 2008.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 July 2009
//
//  Author:
//
//    Original FORTRAN77 original by Shanjie Zhang, Jianming Jin.
//    C++ version by John Burkardt.
//
//    The original FORTRAN77 version of this routine is copyrighted by
//    Shanjie Zhang and Jianming Jin.  However, they give permission to
//    incorporate this routine into a user program provided that the copyright
//    is acknowledged.
//
//  Reference:
//
//    Shanjie Zhang, Jianming Jin,
//    Computation of Special Functions,
//    Wiley, 1996,
//    ISBN: 0-471-11963-6,
//    LC: QA351.C45
//
//  Parameters:
//
//    Input, double A, B, C, X, the arguments of the function.
//    C must not be equal to a nonpositive integer.
//    X < 1.
//
//    Output, double R8_HYPER_2F1, the value of the function.
//
{
  double a0;
  double aa;
  double bb;
  double c0;
  double c1;
  double el = 0.5772156649015329;
  double eps;
  double f0;
  double f1;
  double g0;
  double g1;
  double g2;
  double g3;
  double ga;
  double gabc;
  double gam;
  double gb;
  double gbm;
  double gc;
  double gca;
  double gcab;
  double gcb;
  double gm;
  double hf;
  double hw;
  int j;
  int k;
  bool l0;
  bool l1;
  bool l2;
  bool l3;
  bool l4;
  bool l5;
  int m;
  int nm;
  double pa;
  double pb;
  const double r8_pi = 3.141592653589793;
  double r;
  double r0;
  double r1;
  double rm;
  double rp;
  double sm;
  double sp;
  double sp0;
  double x1;

  l0 = ( c == int( c ) ) && ( c < 0.0 );
  l1 = ( 1.0 - x < 1.0E-15 ) && ( c - a - b <= 0.0 );
  l2 = ( a == int( a ) ) && ( a < 0.0 );
  l3 = ( b == int( b ) ) && ( b < 0.0 );
  l4 = ( c - a == int( c - a ) ) && ( c - a <= 0.0 );
  l5 = ( c - b == int( c - b ) ) && ( c - b <= 0.0 );

  if ( l0 )
  {
    std::cerr << "\n";
    std::cerr << "R8_HYPER_2F1 - Fatal error!\n";
    std::cerr << "  The hypergeometric series is divergent.\n";
    std::cerr << "  C is integral and negative.\n";
    std::cerr << "  C = " << c << "\n";
    exit ( 1 );
  }

  if ( l1 )
  {
    std::cerr << "\n";
    std::cerr << "R8_HYPER_2F1 - Fatal error!\n";
    std::cerr << "  The hypergeometric series is divergent.\n";
    std::cerr << "  1 - X < 0, C - A - B <= 0\n";
    std::cerr << "  A = " << a << "\n";
    std::cerr << "  B = " << b << "\n";
    std::cerr << "  C = " << c << "\n";
    std::cerr << "  X = " << x << "\n";
    exit ( 1 );
  }

  if ( 0.95 < x )
  {
    eps = 1.0E-08;
  }
  else
  {
    eps = 1.0E-15;
  }

  if ( x == 0.0 || a == 0.0 || b == 0.0 )
  {
    hf = 1.0;
    return hf;
  }
  else if ( 1.0 - x == eps && 0.0 < c - a - b )
  {
    gc = tgamma ( c );
    gcab = tgamma ( c - a - b );
    gca = tgamma ( c - a );
    gcb = tgamma ( c - b );
    hf = gc * gcab / ( gca * gcb );
    return hf;
  }
  else if ( 1.0 + x <= eps && fabs ( c - a + b - 1.0 ) <= eps )
  {
    g0 = sqrt ( r8_pi ) * pow ( 2.0, - a );
    g1 = tgamma ( c );
    g2 = tgamma ( 1.0 + a / 2.0 - b );
    g3 = tgamma ( 0.5 + 0.5 * a );
    hf = g0 * g1 / ( g2 * g3 );
    return hf;
  }
  else if ( l2 || l3 )
  {
    if ( l2 )
    {
      nm = int( fabs ( a ) );
    }

    if ( l3 )
    {
      nm = int( fabs ( b ) );
    }

    hf = 1.0;
    r = 1.0;

    for ( k = 1; k <= nm; k++ )
    {
      r = r * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;
      hf = hf + r;
    }

    return hf;
  }
  else if ( l4 || l5 )
  {
    if ( l4 )
    {
      nm = int( fabs ( c - a ) );
    }

    if ( l5 )
    {
      nm = int( fabs ( c - b ) );
    }

    hf = 1.0;
    r  = 1.0;
    for ( k = 1; k <= nm; k++ )
    {
      r = r * ( c - a + k - 1.0 ) * ( c - b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;
      hf = hf + r;
    }
    hf = pow ( 1.0 - x, c - a - b ) * hf;
    return hf;
  }

  aa = a;
  bb = b;
  x1 = x;

  if ( x < 0.0 )
  {
    x = x / ( x - 1.0 );
    if ( a < c && b < a && 0.0 < b )
    {
      a = bb;
      b = aa;
    }
    b = c - b;
  }

  if ( 0.75 <= x )
  {
    gm = 0.0;

    if ( fabs ( c - a - b - int( c - a - b ) ) < 1.0E-15 )
    {
      m = int( c - a - b );
      ga = tgamma ( a );
      gb = tgamma ( b );
      gc = tgamma ( c );
      gam = tgamma ( a + m );
      gbm = tgamma ( b + m );

      pa = r8_psi ( a );
      pb = r8_psi ( b );

      if ( m != 0 )
      {
        gm = 1.0;
      }

      for ( j = 1; j <= std::abs ( m ) - 1; j++ )
      {
        gm = gm * j;
      }

      rm = 1.0;
      for ( j = 1; j <= std::abs ( m ); j++ )
      {
        rm = rm * j;
      }

      f0 = 1.0;
      r0 = 1.0;;
      r1 = 1.0;
      sp0 = 0.0;;
      sp = 0.0;

      if ( 0 <= m )
      {
        c0 = gm * gc / ( gam * gbm );
        c1 = - gc * pow ( x - 1.0, m ) / ( ga * gb * rm );

        for ( k = 1; k <= m - 1; k++ )
        {
          r0 = r0 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
            / ( k * ( k - m ) ) * ( 1.0 - x );
          f0 = f0 + r0;
        }

        for ( k = 1; k <= m; k++ )
        {
          sp0 = sp0 + 1.0 / ( a + k - 1.0 ) + 1.0 / ( b + k - 1.0 ) 
          - 1.0 / double( k );
        }

        f1 = pa + pb + sp0 + 2.0 * el + log ( 1.0 - x );
        hw = f1;

        for ( k = 1; k <= 250; k++ )
        {
          sp = sp + ( 1.0 - a ) / ( k * ( a + k - 1.0 ) ) 
            + ( 1.0 - b ) / ( k * ( b + k - 1.0 ) );

          sm = 0.0;
          for ( j = 1; j <= m; j++ )
          {
            sm = sm + ( 1.0 - a ) 
              / ( ( j + k ) * ( a + j + k - 1.0 ) ) 
              + 1.0 / ( b + j + k - 1.0 );
          }

          rp = pa + pb + 2.0 * el + sp + sm + log ( 1.0 - x );

          r1 = r1 * ( a + m + k - 1.0 ) * ( b + m + k - 1.0 ) 
            / ( k * ( m + k ) ) * ( 1.0 - x );

          f1 = f1 + r1 * rp;

          if ( fabs ( f1 - hw ) < fabs ( f1 ) * eps )
          {
            break;
          }
          hw = f1;
        }
        hf = f0 * c0 + f1 * c1;
      }
      else if ( m < 0 )
      {
        m = - m;
        c0 = gm * gc / ( ga * gb * pow ( 1.0 - x, m ) );
        c1 = - pow ( - 1.0, m ) * gc / ( gam * gbm * rm );

        for ( k = 1; k <= m - 1; k++ )
        {
          r0 = r0 * ( a - m + k - 1.0 ) * ( b - m + k - 1.0 ) 
            / ( k * ( k - m ) ) * ( 1.0 - x );
          f0 = f0 + r0;
        }

        for ( k = 1; k <= m; k++ )
        {
          sp0 = sp0 + 1.0 / double( k );
        }

        f1 = pa + pb - sp0 + 2.0 * el + log ( 1.0 - x );
        hw = f1;

        for ( k = 1; k <= 250; k++ )
        {
          sp = sp + ( 1.0 - a ) 
            / ( k * ( a + k - 1.0 ) ) 
            + ( 1.0 - b ) / ( k * ( b + k - 1.0 ) );

          sm = 0.0;
          for ( j = 1; j <= m; j++ )
          {
            sm = sm + 1.0 / double( j + k );
          }

          rp = pa + pb + 2.0 * el + sp - sm + log ( 1.0 - x );

          r1 = r1 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
            / ( k * ( m + k ) ) * ( 1.0 - x );

          f1 = f1 + r1 * rp;

          if ( fabs ( f1 - hw ) < fabs ( f1 ) * eps )
          {
            break;
          }

          hw = f1;
        }

        hf = f0 * c0 + f1 * c1;
      }
    }
    else
    {
      ga = tgamma ( a );
      gb = tgamma ( b );
      gc = tgamma ( c );
      gca = tgamma ( c - a );
      gcb = tgamma ( c - b );
      gcab = tgamma ( c - a - b );
      gabc = tgamma ( a + b - c );
      c0 = gc * gcab / ( gca * gcb );
      c1 = gc * gabc / ( ga * gb ) * pow ( 1.0 - x, c - a - b );
      hf = 0.0;
      hw = hf;
      r0 = c0;
      r1 = c1;

      for ( k = 1; k <= 250; k++ )
      {
        r0 = r0 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
          / ( k * ( a + b - c + k ) ) * ( 1.0 - x );

        r1 = r1 * ( c - a + k - 1.0 ) * ( c - b + k - 1.0 ) 
          / ( k * ( c - a - b + k ) ) * ( 1.0 - x );

        hf = hf + r0 + r1;

        if ( fabs ( hf - hw ) < fabs ( hf ) * eps )
        {
          break;
        }
        hw = hf;
      }
      hf = hf + c0 + c1;
    }
  }
  else
  {
    a0 = 1.0;

    if ( a < c && c < 2.0 * a && b < c && c < 2.0 * b )
    {
      a0 = pow ( 1.0 - x, c - a - b );
      a = c - a;
      b = c - b;
    }

    hf = 1.0;
    hw = hf;
    r = 1.0;

    for ( k = 1; k <= 250; k++ )
    {
      r = r * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;

      hf = hf + r;

      if ( fabs ( hf - hw ) <= fabs ( hf ) * eps )
      {
        break;
      }

      hw = hf;
    }
    hf = a0 * hf;
  }

  if ( x1 < 0.0 )
  {
    x = x1;
    c0 = 1.0 / pow ( 1.0 - x, aa );
    hf = c0 * hf;
  }

  a = aa;
  b = bb;

  if ( 120 < k )
  {
    std::cout << "\n";
    std::cout << "R8_HYPER_2F1 - Warning!\n";
    std::cout << "  A large number of iterations were needed.\n";
    std::cout << "  The accuracy of the results should be checked.\n";
  }

  return hf;
}